

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O0

int __thiscall xr_entity_factory::init(xr_entity_factory *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  value_type pfVar1;
  iterator iVar2;
  iterator iVar3;
  value_type local_690;
  value_type local_688;
  value_type local_680;
  value_type local_678;
  value_type local_670;
  value_type local_668;
  value_type local_660;
  value_type local_658;
  value_type local_650;
  value_type local_648;
  value_type local_640;
  value_type local_638;
  value_type local_630;
  value_type local_628;
  value_type local_620;
  value_type local_618;
  value_type local_610;
  value_type local_608;
  value_type local_600;
  value_type local_5f8;
  value_type local_5f0;
  value_type local_5e8;
  value_type local_5e0;
  value_type local_5d8;
  value_type local_5d0;
  value_type local_5c8;
  value_type local_5c0;
  value_type local_5b8;
  value_type local_5b0;
  value_type local_5a8;
  value_type local_5a0;
  value_type local_598;
  value_type local_590;
  value_type local_588;
  value_type local_580;
  value_type local_578;
  value_type local_570;
  value_type local_568;
  value_type local_560;
  value_type local_558;
  value_type local_550;
  value_type local_548;
  value_type local_540;
  value_type local_538;
  value_type local_530;
  value_type local_528;
  value_type local_520;
  value_type local_518;
  value_type local_510;
  value_type local_508;
  value_type local_500;
  value_type local_4f8;
  value_type local_4f0;
  value_type local_4e8;
  value_type local_4e0;
  value_type local_4d8;
  value_type local_4d0;
  value_type local_4c8;
  value_type local_4c0;
  value_type local_4b8;
  value_type local_4b0;
  value_type local_4a8;
  value_type local_4a0;
  value_type local_498;
  value_type local_490;
  value_type local_488;
  value_type local_480;
  value_type local_478;
  value_type local_470;
  value_type local_468;
  value_type local_460;
  value_type local_458;
  value_type local_450;
  value_type local_448;
  value_type local_440;
  value_type local_438;
  value_type local_430;
  value_type local_428;
  value_type local_420;
  value_type local_418;
  value_type local_410;
  value_type local_408;
  value_type local_400;
  value_type local_3f8;
  value_type local_3f0;
  value_type local_3e8;
  value_type local_3e0;
  value_type local_3d8;
  value_type local_3d0;
  value_type local_3c8;
  value_type local_3c0;
  value_type local_3b8;
  value_type local_3b0;
  value_type local_3a8;
  value_type local_3a0;
  value_type local_398;
  value_type local_390;
  value_type local_388;
  value_type local_380;
  value_type local_378;
  value_type local_370;
  value_type local_368;
  value_type local_360;
  value_type local_358;
  value_type local_350;
  value_type local_348;
  value_type local_340;
  value_type local_338;
  value_type local_330;
  value_type local_328;
  value_type local_320;
  value_type local_318;
  value_type local_310;
  value_type local_308;
  value_type local_300;
  value_type local_2f8;
  value_type local_2f0;
  value_type local_2e8;
  value_type local_2e0;
  value_type local_2d8;
  value_type local_2d0;
  value_type local_2c8;
  value_type local_2c0;
  value_type local_2b8;
  value_type local_2b0;
  value_type local_2a8;
  value_type local_2a0;
  value_type local_298;
  value_type local_290;
  value_type local_288;
  value_type local_280;
  value_type local_278;
  value_type local_270;
  value_type local_268;
  value_type local_260;
  value_type local_258;
  value_type local_250;
  value_type local_248;
  value_type local_240;
  value_type local_238;
  value_type local_230;
  value_type local_228;
  value_type local_220;
  value_type local_218;
  value_type local_210;
  value_type local_208;
  value_type local_200;
  value_type local_1f8;
  value_type local_1f0;
  value_type local_1e8;
  value_type local_1e0;
  value_type local_1d8;
  value_type local_1d0;
  value_type local_1c8;
  value_type local_1c0;
  value_type local_1b8;
  value_type local_1b0;
  value_type local_1a8;
  value_type local_1a0;
  value_type local_198;
  value_type local_190;
  value_type local_188;
  value_type local_180;
  value_type local_178;
  value_type local_170;
  value_type local_168;
  value_type local_160;
  value_type local_158;
  value_type local_150;
  value_type local_148;
  value_type local_140;
  value_type local_138;
  value_type local_130;
  value_type local_128;
  value_type local_120;
  value_type local_118;
  value_type local_110;
  value_type local_108;
  value_type local_100;
  value_type local_f8;
  value_type local_f0;
  value_type local_e8;
  value_type local_e0;
  value_type local_d8;
  value_type local_d0;
  value_type local_c8;
  value_type local_c0;
  value_type local_b8;
  value_type local_b0;
  value_type local_a8;
  value_type local_a0;
  value_type local_98;
  value_type local_90;
  value_type local_88;
  value_type local_80;
  value_type local_78;
  value_type local_70;
  value_type local_68;
  value_type local_60;
  value_type local_58;
  value_type local_50;
  value_type local_48;
  value_type local_40;
  value_type local_38;
  value_type local_30 [3];
  value_type local_18;
  xr_entity_factory *local_10;
  xr_entity_factory *this_local;
  
  local_10 = this;
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_graph_point>::factory_item
            ((factory_item<xray_re::cse_alife_graph_point> *)pfVar1,"AI_GRAPH");
  local_18 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_18);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_online_offline_group>::factory_item
            ((factory_item<xray_re::cse_alife_online_offline_group> *)pfVar1,"ON_OFF_G");
  local_30[0] = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,local_30);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_actor>::factory_item((factory_item<xray_re::se_actor> *)pfVar1,"O_ACTOR")
  ;
  local_38 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_38);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_FLESH");
  local_40 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_40);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_HIMER");
  local_48 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_48);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_DOG_R");
  local_50 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_50);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_human_stalker>::factory_item
            ((factory_item<xray_re::cse_alife_human_stalker> *)pfVar1,"AI_STL");
  local_58 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_58);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_BLOOD");
  local_60 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_60);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_BOAR");
  local_68 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_68);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_DOG_B");
  local_70 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_70);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_DOG_P");
  local_78 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_78);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_psy_dog_phantom>::factory_item
            ((factory_item<xray_re::cse_alife_psy_dog_phantom> *)pfVar1,"AI_DOG_F");
  local_80 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_80);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_BURER");
  local_88 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_88);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_GIANT");
  local_90 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_90);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_CONTR");
  local_98 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_98);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_POLTR");
  local_a0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_a0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_ZOM");
  local_a8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_a8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_FRACT");
  local_b0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_b0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_SNORK");
  local_b8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_b8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_CAT");
  local_c0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_c0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_monster_base>::factory_item
            ((factory_item<xray_re::cse_alife_monster_base> *)pfVar1,"AI_TUSH");
  local_c8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_c8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_creature_phantom>::factory_item
            ((factory_item<xray_re::cse_alife_creature_phantom> *)pfVar1,"AI_PHANT");
  local_d0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_d0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_trader>::factory_item
            ((factory_item<xray_re::cse_alife_trader> *)pfVar1,"AI_TRADE");
  local_d8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_d8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_creature_crow>::factory_item
            ((factory_item<xray_re::cse_alife_creature_crow> *)pfVar1,"AI_CROW");
  local_e0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_e0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_car>::factory_item
            ((factory_item<xray_re::cse_alife_car> *)pfVar1,"C_NIVA");
  local_e8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_e8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_helicopter>::factory_item
            ((factory_item<xray_re::cse_alife_helicopter> *)pfVar1,"C_HLCPTR");
  local_f0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_f0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_MBALL");
  local_f8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_f8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_BDROP");
  local_100 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_100);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_NEEDL");
  local_108 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_108);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_BAST");
  local_110 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_110);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_BGRAV");
  local_118 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_118);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_DUMMY");
  local_120 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_120);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_ZUDA");
  local_128 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_128);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_THORN");
  local_130 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_130);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_FBALL");
  local_138 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_138);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_EBALL");
  local_140 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_140);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_RHAIR");
  local_148 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_148);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_GALAN");
  local_150 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_150);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"ARTEFACT");
  local_158 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_158);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_WMAGAZ");
  local_160 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_160);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl> *)pfVar1,"W_WMAGGL");
  local_168 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_168);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl> *)pfVar1,"W_FN2000");
  local_170 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_170);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl> *)pfVar1,"W_AK74");
  local_178 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_178);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_LR300");
  local_180 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_180);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_HPSA");
  local_188 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_188);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_PM");
  local_190 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_190);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_FORT");
  local_198 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_198);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_BINOC");
  local_1a0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1a0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_shotgun>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_shotgun> *)pfVar1,"W_SHOTGN");
  local_1a8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1a8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_SVD");
  local_1b0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1b0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_SVU");
  local_1b8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1b8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_RPG7");
  local_1c0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1c0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_VAL");
  local_1c8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1c8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_VINT");
  local_1d0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1d0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_WALTHR");
  local_1d8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1d8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined> *)pfVar1,"W_USP45");
  local_1e0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1e0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_magazined_w_gl> *)pfVar1,"W_GROZA");
  local_1e8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1e8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon> *)pfVar1,"W_KNIFE");
  local_1f0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1f0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_shotgun>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_shotgun> *)pfVar1,"W_BM16");
  local_1f8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_1f8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_weapon_shotgun>::factory_item
            ((factory_item<xray_re::cse_alife_item_weapon_shotgun> *)pfVar1,"W_RG6");
  local_200 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_200);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"AMMO");
  local_208 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_208);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"A_VOG25");
  local_210 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_210);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"A_OG7B");
  local_218 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_218);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"A_M209");
  local_220 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_220);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"W_SCOPE");
  local_228 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_228);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"W_SILENC");
  local_230 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_230);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"W_GLAUNC");
  local_238 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_238);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_bolt>::factory_item
            ((factory_item<xray_re::cse_alife_item_bolt> *)pfVar1,"II_BOLT");
  local_240 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_240);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_MEDKI");
  local_248 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_248);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_BANDG");
  local_250 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_250);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_ANTIR");
  local_258 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_258);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_FOOD");
  local_260 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_260);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_BOTTL");
  local_268 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_268);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_explosive>::factory_item
            ((factory_item<xray_re::cse_alife_item_explosive> *)pfVar1,"II_EXPLO");
  local_270 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_270);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_document>::factory_item
            ((factory_item<xray_re::cse_alife_item_document> *)pfVar1,"II_DOC");
  local_278 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_278);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_ATTCH");
  local_280 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_280);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_custom_outfit>::factory_item
            ((factory_item<xray_re::cse_alife_item_custom_outfit> *)pfVar1,"EQU_SCIE");
  local_288 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_288);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_custom_outfit>::factory_item
            ((factory_item<xray_re::cse_alife_item_custom_outfit> *)pfVar1,"EQU_STLK");
  local_290 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_290);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_custom_outfit>::factory_item
            ((factory_item<xray_re::cse_alife_item_custom_outfit> *)pfVar1,"EQU_MLTR");
  local_298 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_298);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_custom_outfit>::factory_item
            ((factory_item<xray_re::cse_alife_item_custom_outfit> *)pfVar1,"EQU_EXO");
  local_2a0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2a0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_grenade>::factory_item
            ((factory_item<xray_re::cse_alife_item_grenade> *)pfVar1,"G_F1");
  local_2a8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2a8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_grenade>::factory_item
            ((factory_item<xray_re::cse_alife_item_grenade> *)pfVar1,"G_RGD5");
  local_2b0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2b0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"MP_PLBAG");
  local_2b8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2b8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_custom_zone>::factory_item
            ((factory_item<xray_re::cse_alife_custom_zone> *)pfVar1,"Z_ZONE");
  local_2c0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2c0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_MBALD");
  local_2c8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2c8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_MINCER");
  local_2d0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2d0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_ACIDF");
  local_2d8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2d8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_GALANT");
  local_2e0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2e0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_RADIO");
  local_2e8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2e8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_zone_visual>::factory_item
            ((factory_item<xray_re::cse_alife_zone_visual> *)pfVar1,"Z_BFUZZ");
  local_2f0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2f0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_zone_visual>::factory_item
            ((factory_item<xray_re::cse_alife_zone_visual> *)pfVar1,"Z_RUSTYH");
  local_2f8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_2f8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_DEAD");
  local_300 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_300);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_space_restrictor>::factory_item
            ((factory_item<xray_re::cse_alife_space_restrictor> *)pfVar1,"SCRIPTZN");
  local_308 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_308);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_smart_zone>::factory_item
            ((factory_item<xray_re::cse_alife_smart_zone> *)pfVar1,"SMRTZONE");
  local_310 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_310);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_team_base_zone>::factory_item
            ((factory_item<xray_re::cse_alife_team_base_zone> *)pfVar1,"Z_TEAMBS");
  local_318 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_318);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_torrid_zone>::factory_item
            ((factory_item<xray_re::cse_alife_torrid_zone> *)pfVar1,"Z_TORRID");
  local_320 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_320);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_space_restrictor>::factory_item
            ((factory_item<xray_re::cse_alife_space_restrictor> *)pfVar1,"SPACE_RS");
  local_328 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_328);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_zone_visual>::factory_item
            ((factory_item<xray_re::cse_alife_zone_visual> *)pfVar1,"Z_AMEBA");
  local_330 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_330);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_NOGRAV");
  local_338 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_338);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_detector>::factory_item
            ((factory_item<xray_re::cse_alife_item_detector> *)pfVar1,"D_SIMDET");
  local_340 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_340);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_torch>::factory_item
            ((factory_item<xray_re::cse_alife_item_torch> *)pfVar1,"D_TORCH");
  local_348 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_348);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_pda>::factory_item
            ((factory_item<xray_re::cse_alife_item_pda> *)pfVar1,"D_PDA");
  local_350 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_350);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_projector>::factory_item
            ((factory_item<xray_re::cse_alife_object_projector> *)pfVar1,"O_SEARCH");
  local_358 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_358);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_mounted_weapon>::factory_item
            ((factory_item<xray_re::cse_alife_mounted_weapon> *)pfVar1,"W_MOUNTD");
  local_360 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_360);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_stationary_mgun>::factory_item
            ((factory_item<xray_re::cse_alife_stationary_mgun> *)pfVar1,"W_STMGUN");
  local_368 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_368);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_hanging_lamp>::factory_item
            ((factory_item<xray_re::cse_alife_object_hanging_lamp> *)pfVar1,"O_HLAMP");
  local_370 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_370);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_physic>::factory_item
            ((factory_item<xray_re::cse_alife_object_physic> *)pfVar1,"O_PHYSIC");
  local_378 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_378);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_dynamic_object_visual>::factory_item
            ((factory_item<xray_re::cse_alife_dynamic_object_visual> *)pfVar1,"SCRPTOBJ");
  local_380 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_380);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_breakable>::factory_item
            ((factory_item<xray_re::cse_alife_object_breakable> *)pfVar1,"O_BRKBL");
  local_388 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_388);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_climable>::factory_item
            ((factory_item<xray_re::cse_alife_object_climable> *)pfVar1,"O_CLMBL");
  local_390 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_390);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_ph_skeleton_object>::factory_item
            ((factory_item<xray_re::cse_alife_ph_skeleton_object> *)pfVar1,"P_SKELET");
  local_398 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_398);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_physic>::factory_item
            ((factory_item<xray_re::cse_alife_object_physic> *)pfVar1,"P_DSTRBL");
  local_3a0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3a0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_inventory_box>::factory_item
            ((factory_item<xray_re::cse_inventory_box> *)pfVar1,"O_INVBOX");
  local_3a8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3a8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_detector>::factory_item
            ((factory_item<xray_re::cse_alife_item_detector> *)pfVar1,"D_ELITE");
  local_3b0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3b0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_detector>::factory_item
            ((factory_item<xray_re::cse_alife_item_detector> *)pfVar1,"D_ADVANC");
  local_3b8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3b8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"D_FLARE");
  local_3c0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3c0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"II_BTTCH");
  local_3c8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3c8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"NW_ATTCH");
  local_3d0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3d0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_anomalous_zone>::factory_item
            ((factory_item<xray_re::cse_alife_anomalous_zone> *)pfVar1,"Z_CFIRE");
  local_3d8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3d8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_artefact>::factory_item
            ((factory_item<xray_re::cse_alife_item_artefact> *)pfVar1,"AF_CTA");
  local_3e0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3e0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_physic>::factory_item
            ((factory_item<xray_re::cse_alife_object_physic> *)pfVar1,"O_DSTR_S");
  local_3e8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3e8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_object_hanging_lamp>::factory_item
            ((factory_item<xray_re::cse_alife_object_hanging_lamp> *)pfVar1,"SO_HLAMP");
  local_3f0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3f0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_grenade>::factory_item
            ((factory_item<xray_re::cse_alife_item_grenade> *)pfVar1,"G_F1_S");
  local_3f8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_3f8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_grenade>::factory_item
            ((factory_item<xray_re::cse_alife_item_grenade> *)pfVar1,"G_RGD5_S");
  local_400 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_400);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_pda>::factory_item
            ((factory_item<xray_re::cse_alife_item_pda> *)pfVar1,"S_PDA");
  local_408 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_408);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"S_FOOD");
  local_410 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_410);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"WP_GLAUN");
  local_418 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_418);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item>::factory_item
            ((factory_item<xray_re::cse_alife_item> *)pfVar1,"WP_SILEN");
  local_420 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_420);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"AMMO_S");
  local_428 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_428);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"S_VOG25");
  local_430 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_430);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"S_M209");
  local_438 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_438);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_ammo>::factory_item
            ((factory_item<xray_re::cse_alife_item_ammo> *)pfVar1,"S_OG7B");
  local_440 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_440);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_helmet>::factory_item
            ((factory_item<xray_re::cse_alife_item_helmet> *)pfVar1,"E_HLMET");
  local_448 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_448);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_explosive>::factory_item
            ((factory_item<xray_re::cse_alife_item_explosive> *)pfVar1,"S_EXPLO");
  local_450 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_450);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_alife_item_detector>::factory_item
            ((factory_item<xray_re::cse_alife_item_detector> *)pfVar1,"DET_ELIT");
  local_458 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_458);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_level_changer>::factory_item
            ((factory_item<xray_re::se_level_changer> *)pfVar1,"LVL_CHNG");
  local_460 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_460);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_smart_terrain>::factory_item
            ((factory_item<xray_re::se_smart_terrain> *)pfVar1,"SMRTTRRN");
  local_468 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_468);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_respawn>::factory_item
            ((factory_item<xray_re::se_respawn> *)pfVar1,"RE_SPAWN");
  local_470 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_470);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_stalker>::factory_item
            ((factory_item<xray_re::se_stalker> *)pfVar1,"AI_STL_S");
  local_478 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_478);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_trader>::factory_item
            ((factory_item<xray_re::se_trader> *)pfVar1,"AI_TRD_S");
  local_480 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_480);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_heli>::factory_item((factory_item<xray_re::se_heli> *)pfVar1,"C_HLCP_S");
  local_488 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_488);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_restrictor>::factory_item
            ((factory_item<xray_re::se_restrictor> *)pfVar1,"SPC_RS_S");
  local_490 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_490);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_physic>::factory_item
            ((factory_item<xray_re::se_physic> *)pfVar1,"O_PHYS_S");
  local_498 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_498);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_artefact>::factory_item
            ((factory_item<xray_re::se_artefact> *)pfVar1,"SCRPTART");
  local_4a0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4a0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_car>::factory_item((factory_item<xray_re::se_car> *)pfVar1,"SCRPTCAR");
  local_4a8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4a8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_BLOOD");
  local_4b0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4b0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_BOARW");
  local_4b8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4b8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_DOG_S");
  local_4c0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4c0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_FLESH");
  local_4c8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4c8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_P_DOG");
  local_4d0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4d0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_BURER");
  local_4d8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4d8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_CAT_S");
  local_4e0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4e0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_CHIMS");
  local_4e8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4e8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_CONTR");
  local_4f0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4f0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_IZLOM");
  local_4f8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_4f8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_POLTR");
  local_500 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_500);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_GIANT");
  local_508 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_508);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_ZOMBI");
  local_510 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_510);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_SNORK");
  local_518 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_518);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_TUSHK");
  local_520 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_520);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_DOG_P");
  local_528 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_528);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_DOG_F");
  local_530 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_530);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_item_torch>::factory_item
            ((factory_item<xray_re::se_item_torch> *)pfVar1,"TORCH_S");
  local_538 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_538);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_outfit>::factory_item
            ((factory_item<xray_re::se_outfit> *)pfVar1,"E_STLK");
  local_540 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_540);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_item>::factory_item((factory_item<xray_re::se_item> *)pfVar1,"WP_SCOPE");
  local_548 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_548);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::se_weapon_magazined_w_gl> *)pfVar1,"WP_AK74");
  local_550 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_550);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_LR300");
  local_558 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_558);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_BINOC");
  local_560 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_560);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_shotgun>::factory_item
            ((factory_item<xray_re::se_weapon_shotgun> *)pfVar1,"WP_BM16");
  local_568 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_568);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined_w_gl>::factory_item
            ((factory_item<xray_re::se_weapon_magazined_w_gl> *)pfVar1,"WP_GROZA");
  local_570 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_570);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_SVD");
  local_578 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_578);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_HPSA");
  local_580 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_580);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon>::factory_item
            ((factory_item<xray_re::se_weapon> *)pfVar1,"WP_KNIFE");
  local_588 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_588);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_PM");
  local_590 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_590);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_shotgun>::factory_item
            ((factory_item<xray_re::se_weapon_shotgun> *)pfVar1,"WP_RG6");
  local_598 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_598);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_RPG7");
  local_5a0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5a0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_shotgun>::factory_item
            ((factory_item<xray_re::se_weapon_shotgun> *)pfVar1,"WP_SHOTG");
  local_5a8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5a8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_MAGAZ");
  local_5b0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5b0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_SVU");
  local_5b8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5b8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_USP45");
  local_5c0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5c0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_VAL");
  local_5c8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5c8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_VINT");
  local_5d0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5d0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_magazined>::factory_item
            ((factory_item<xray_re::se_weapon_magazined> *)pfVar1,"WP_WALTH");
  local_5d8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5d8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_zone_visual>::factory_item
            ((factory_item<xray_re::se_zone_visual> *)pfVar1,"ZS_BFUZZ");
  local_5e0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5e0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"ZS_MBALD");
  local_5e8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5e8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"ZS_GALAN");
  local_5f0 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5f0);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"ZS_MINCE");
  local_5f8 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_5f8);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_actor>::factory_item((factory_item<xray_re::se_actor> *)pfVar1,"S_ACTOR")
  ;
  local_600 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_600);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_sim_faction>::factory_item
            ((factory_item<xray_re::se_sim_faction> *)pfVar1,"SFACTION");
  local_608 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_608);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_smart_cover>::factory_item
            ((factory_item<xray_re::se_smart_cover> *)pfVar1,"SMRT_C_S");
  local_610 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_610);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_anomaly_field>::factory_item
            ((factory_item<xray_re::se_anomaly_field> *)pfVar1,"ANOMFLD1");
  local_618 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_618);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_turret_mgun>::factory_item
            ((factory_item<xray_re::se_turret_mgun> *)pfVar1,"TURRETMG");
  local_620 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_620);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"Z_MINES");
  local_628 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_628);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_invbox>::factory_item
            ((factory_item<xray_re::se_invbox> *)pfVar1,"S_INVBOX");
  local_630 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_630);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"ZS_RADIO");
  local_638 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_638);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_zone_torrid>::factory_item
            ((factory_item<xray_re::se_zone_torrid> *)pfVar1,"ZS_TORRD");
  local_640 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_640);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_weapon_shotgun>::factory_item
            ((factory_item<xray_re::se_weapon_shotgun> *)pfVar1,"WP_ASHTG");
  local_648 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_648);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_KARLO");
  local_650 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_650);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_monster>::factory_item
            ((factory_item<xray_re::se_monster> *)pfVar1,"SM_RAT");
  local_658 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_658);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_shelter>::factory_item
            ((factory_item<xray_re::se_shelter> *)pfVar1,"LA_SHELT");
  local_660 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_660);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_item>::factory_item((factory_item<xray_re::se_item> *)pfVar1,"IS_ATTCH");
  local_668 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_668);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_zone_anom>::factory_item
            ((factory_item<xray_re::se_zone_anom> *)pfVar1,"ZS_NOGRA");
  local_670 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_670);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_zone_visual>::factory_item
            ((factory_item<xray_re::se_zone_visual> *)pfVar1,"ZS_RUSTY");
  local_678 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_678);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_safe>::factory_item((factory_item<xray_re::se_safe> *)pfVar1,"LA_PHSAF");
  local_680 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_680);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::se_safe>::factory_item((factory_item<xray_re::se_safe> *)pfVar1,"LA_SAFE");
  local_688 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_688);
  pfVar1 = (value_type)operator_new(0x10);
  factory_item<xray_re::cse_turret_mgun>::factory_item
            ((factory_item<xray_re::cse_turret_mgun> *)pfVar1,"W_TURRET");
  local_690 = pfVar1;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::push_back
            (&this->m_clsids,&local_690);
  iVar2 = std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::begin
                    (&this->m_clsids);
  iVar3 = std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::end
                    (&this->m_clsids);
  std::
  sort<__gnu_cxx::__normal_iterator<factory_item_base**,std::vector<factory_item_base*,std::allocator<factory_item_base*>>>,clsid_pred>
            (iVar2._M_current,iVar3._M_current);
  return extraout_EAX;
}

Assistant:

void xr_entity_factory::init()
{
	// engine classes
	m_clsids.push_back(new factory_item<cse_alife_graph_point>("AI_GRAPH"));
	m_clsids.push_back(new factory_item<cse_alife_online_offline_group>("ON_OFF_G"));
	m_clsids.push_back(new factory_item<se_actor>("O_ACTOR"));	// was cse_alife_creature_actor in SoC
//	m_clsids.push_back(new factory_item<cse_spectator>("SPECT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_FLESH"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_HIMER"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_DOG_R"));
	m_clsids.push_back(new factory_item<cse_alife_human_stalker>("AI_STL"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_BLOOD"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_BOAR"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_DOG_B"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_DOG_P"));
	m_clsids.push_back(new factory_item<cse_alife_psy_dog_phantom>("AI_DOG_F"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_BURER"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_GIANT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_CONTR"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_POLTR"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_ZOM"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_FRACT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_SNORK"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_CAT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_TUSH"));
	m_clsids.push_back(new factory_item<cse_alife_creature_phantom>("AI_PHANT"));
	m_clsids.push_back(new factory_item<cse_alife_trader>("AI_TRADE"));
	m_clsids.push_back(new factory_item<cse_alife_creature_crow>("AI_CROW"));
	m_clsids.push_back(new factory_item<cse_alife_car>("C_NIVA"));
	m_clsids.push_back(new factory_item<cse_alife_helicopter>("C_HLCPTR"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_MBALL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_BDROP"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_NEEDL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_BAST"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_BGRAV"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_DUMMY"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_ZUDA"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_THORN"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_FBALL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_EBALL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_RHAIR"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_GALAN"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("ARTEFACT"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_WMAGAZ"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_WMAGGL"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_FN2000"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_AK74"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_LR300"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_HPSA"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_PM"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_FORT"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_BINOC"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_shotgun>("W_SHOTGN"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_SVD"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_SVU"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_RPG7"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_VAL"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_VINT"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_WALTHR"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_USP45"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_GROZA"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon>("W_KNIFE"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_shotgun>("W_BM16"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_shotgun>("W_RG6"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("AMMO"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("A_VOG25"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("A_OG7B"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("A_M209"));
	m_clsids.push_back(new factory_item<cse_alife_item>("W_SCOPE"));
	m_clsids.push_back(new factory_item<cse_alife_item>("W_SILENC"));
	m_clsids.push_back(new factory_item<cse_alife_item>("W_GLAUNC"));
	m_clsids.push_back(new factory_item<cse_alife_item_bolt>("II_BOLT"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_MEDKI"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_BANDG"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_ANTIR"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_FOOD"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_BOTTL"));
	m_clsids.push_back(new factory_item<cse_alife_item_explosive>("II_EXPLO"));
	m_clsids.push_back(new factory_item<cse_alife_item_document>("II_DOC"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_ATTCH"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_SCIE"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_STLK"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_MLTR"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_EXO"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_F1"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_RGD5"));
//	m_clsids.push_back(new factory_item<cse_temporary>("G_RPG7"));
//	m_clsids.push_back(new factory_item<cse_temporary>("G_FAKE"));
	m_clsids.push_back(new factory_item<cse_alife_item>("MP_PLBAG"));
	m_clsids.push_back(new factory_item<cse_alife_custom_zone>("Z_ZONE"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_MBALD"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_MINCER"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_ACIDF"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_GALANT"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_RADIO"));
	m_clsids.push_back(new factory_item<cse_alife_zone_visual>("Z_BFUZZ"));
	m_clsids.push_back(new factory_item<cse_alife_zone_visual>("Z_RUSTYH"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_DEAD"));
	m_clsids.push_back(new factory_item<cse_alife_space_restrictor>("SCRIPTZN"));
	m_clsids.push_back(new factory_item<cse_alife_smart_zone>("SMRTZONE"));
	m_clsids.push_back(new factory_item<cse_alife_team_base_zone>("Z_TEAMBS"));
	m_clsids.push_back(new factory_item<cse_alife_torrid_zone>("Z_TORRID"));
	m_clsids.push_back(new factory_item<cse_alife_space_restrictor>("SPACE_RS"));
	m_clsids.push_back(new factory_item<cse_alife_zone_visual>("Z_AMEBA"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_NOGRAV"));
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("D_SIMDET"));
	m_clsids.push_back(new factory_item<cse_alife_item_torch>("D_TORCH"));
	m_clsids.push_back(new factory_item<cse_alife_item_pda>("D_PDA"));
	m_clsids.push_back(new factory_item<cse_alife_object_projector>("O_SEARCH"));
	m_clsids.push_back(new factory_item<cse_alife_mounted_weapon>("W_MOUNTD"));
	m_clsids.push_back(new factory_item<cse_alife_stationary_mgun>("W_STMGUN"));
	m_clsids.push_back(new factory_item<cse_alife_object_hanging_lamp>("O_HLAMP"));
	m_clsids.push_back(new factory_item<cse_alife_object_physic>("O_PHYSIC"));
	m_clsids.push_back(new factory_item<cse_alife_dynamic_object_visual>("SCRPTOBJ"));
	m_clsids.push_back(new factory_item<cse_alife_object_breakable>("O_BRKBL"));
	m_clsids.push_back(new factory_item<cse_alife_object_climable>("O_CLMBL"));
	m_clsids.push_back(new factory_item<cse_alife_ph_skeleton_object>("P_SKELET"));
	m_clsids.push_back(new factory_item<cse_alife_object_physic>("P_DSTRBL"));
	m_clsids.push_back(new factory_item<cse_inventory_box>("O_INVBOX"));
	// Clear Sky (including build 3120) engine classes
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("D_ELITE"));
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("D_ADVANC"));
	m_clsids.push_back(new factory_item<cse_alife_item>("D_FLARE"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_BTTCH"));
	m_clsids.push_back(new factory_item<cse_alife_item>("NW_ATTCH"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_CFIRE"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_CTA"));

	// CoP new engine classes
	m_clsids.push_back(new factory_item<cse_alife_object_physic>("O_DSTR_S"));
	m_clsids.push_back(new factory_item<cse_alife_object_hanging_lamp>("SO_HLAMP"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_F1_S"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_RGD5_S"));
	m_clsids.push_back(new factory_item<cse_alife_item_pda>("S_PDA"));
	m_clsids.push_back(new factory_item<cse_alife_item>("S_FOOD"));
	m_clsids.push_back(new factory_item<cse_alife_item>("WP_GLAUN"));
	m_clsids.push_back(new factory_item<cse_alife_item>("WP_SILEN"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("AMMO_S"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("S_VOG25"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("S_M209"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("S_OG7B"));
	m_clsids.push_back(new factory_item<cse_alife_item_helmet>("E_HLMET"));
	m_clsids.push_back(new factory_item<cse_alife_item_explosive>("S_EXPLO"));
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("DET_ELIT"));

	// script classes
	m_clsids.push_back(new factory_item<se_level_changer>("LVL_CHNG"));	// was cse_alife_level_changer in pre-3502 builds
	m_clsids.push_back(new factory_item<se_smart_terrain>("SMRTTRRN"));
	m_clsids.push_back(new factory_item<se_respawn>("RE_SPAWN"));
//	m_clsids.push_back(new factory_item<cse_switcher>("O_SWITCH"));
	m_clsids.push_back(new factory_item<se_stalker>("AI_STL_S"));
	m_clsids.push_back(new factory_item<se_trader>("AI_TRD_S"));
	m_clsids.push_back(new factory_item<se_heli>("C_HLCP_S"));
	m_clsids.push_back(new factory_item<se_restrictor>("SPC_RS_S"));
	m_clsids.push_back(new factory_item<se_physic>("O_PHYS_S"));
	m_clsids.push_back(new factory_item<se_artefact>("SCRPTART"));
	m_clsids.push_back(new factory_item<se_car>("SCRPTCAR"));
	m_clsids.push_back(new factory_item<se_monster>("SM_BLOOD"));
	m_clsids.push_back(new factory_item<se_monster>("SM_BOARW"));
	m_clsids.push_back(new factory_item<se_monster>("SM_DOG_S"));
	m_clsids.push_back(new factory_item<se_monster>("SM_FLESH"));
	m_clsids.push_back(new factory_item<se_monster>("SM_P_DOG"));
	m_clsids.push_back(new factory_item<se_monster>("SM_BURER"));
	m_clsids.push_back(new factory_item<se_monster>("SM_CAT_S"));
	m_clsids.push_back(new factory_item<se_monster>("SM_CHIMS"));
	m_clsids.push_back(new factory_item<se_monster>("SM_CONTR"));
	m_clsids.push_back(new factory_item<se_monster>("SM_IZLOM"));
	m_clsids.push_back(new factory_item<se_monster>("SM_POLTR"));
	m_clsids.push_back(new factory_item<se_monster>("SM_GIANT"));
	m_clsids.push_back(new factory_item<se_monster>("SM_ZOMBI"));
	m_clsids.push_back(new factory_item<se_monster>("SM_SNORK"));
	m_clsids.push_back(new factory_item<se_monster>("SM_TUSHK"));
	m_clsids.push_back(new factory_item<se_monster>("SM_DOG_P"));
	m_clsids.push_back(new factory_item<se_monster>("SM_DOG_F"));
	m_clsids.push_back(new factory_item<se_item_torch>("TORCH_S"));
	m_clsids.push_back(new factory_item<se_outfit>("E_STLK"));
	m_clsids.push_back(new factory_item<se_item>("WP_SCOPE"));
	m_clsids.push_back(new factory_item<se_weapon_magazined_w_gl>("WP_AK74"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_LR300"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_BINOC"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_BM16"));
	m_clsids.push_back(new factory_item<se_weapon_magazined_w_gl>("WP_GROZA"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_SVD"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_HPSA"));
	m_clsids.push_back(new factory_item<se_weapon>("WP_KNIFE"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_PM"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_RG6"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_RPG7"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_SHOTG"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_MAGAZ"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_SVU"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_USP45"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_VAL"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_VINT"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_WALTH"));
	m_clsids.push_back(new factory_item<se_zone_visual>("ZS_BFUZZ"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_MBALD"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_GALAN"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_MINCE"));
	// clear sky script classes
	m_clsids.push_back(new factory_item<se_actor>("S_ACTOR"));			// + CoP
	m_clsids.push_back(new factory_item<se_sim_faction>("SFACTION"));
	m_clsids.push_back(new factory_item<se_smart_cover>("SMRT_C_S"));	// + CoP

	// ZENOBIAN mod script classes
	m_clsids.push_back(new factory_item<se_anomaly_field>("ANOMFLD1"));
	m_clsids.push_back(new factory_item<se_turret_mgun>("TURRETMG"));
	m_clsids.push_back(new factory_item<se_zone_anom>("Z_MINES"));
	
	// CoP new script classes
	m_clsids.push_back(new factory_item<se_invbox>("S_INVBOX"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_RADIO"));
	m_clsids.push_back(new factory_item<se_zone_torrid>("ZS_TORRD"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_ASHTG"));

	//LA new script classes
	m_clsids.push_back(new factory_item<se_monster>("SM_KARLO"));
	m_clsids.push_back(new factory_item<se_monster>("SM_RAT"));
	m_clsids.push_back(new factory_item<se_shelter>("LA_SHELT"));
	m_clsids.push_back(new factory_item<se_item>("IS_ATTCH"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_NOGRA"));
	m_clsids.push_back(new factory_item<se_zone_visual>("ZS_RUSTY"));
	m_clsids.push_back(new factory_item<se_safe>("LA_PHSAF"));
	m_clsids.push_back(new factory_item<se_safe>("LA_SAFE"));
	m_clsids.push_back(new factory_item<cse_turret_mgun>("W_TURRET"));

	// prepare for bisection
	std::sort(m_clsids.begin(), m_clsids.end(), clsid_pred());
}